

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O3

void __thiscall CppGenerator::CppGenerator(CppGenerator *this,shared_ptr<Launcher> *launcher)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  
  (this->super_CodeGenerator)._vptr_CodeGenerator = (_func_int **)&PTR__CppGenerator_002d7c78;
  (this->_pathToData)._M_dataplus._M_p = (pointer)&(this->_pathToData).field_2;
  (this->_pathToData)._M_string_length = 0;
  (this->_pathToData).field_2._M_local_buf[0] = '\0';
  (this->_outputDirectory)._M_dataplus._M_p = (pointer)&(this->_outputDirectory).field_2;
  (this->_outputDirectory)._M_string_length = 0;
  (this->_outputDirectory).field_2._M_local_buf[0] = '\0';
  (this->_datasetName)._M_dataplus._M_p = (pointer)&(this->_datasetName).field_2;
  (this->_datasetName)._M_string_length = 0;
  (this->_datasetName).field_2._M_local_buf[0] = '\0';
  (this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->variableOrder = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
  (this->variableOrderBitset).
  super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->variableOrderBitset).
  super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->variableOrderBitset).
  super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->incomingViews = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
  this->groupVariableOrder = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
  this->groupIncomingViews = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
  this->groupViewsPerVarInfo = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
  (this->groupVariableOrderBitset).
  super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->groupVariableOrderBitset).
  super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->groupVariableOrderBitset).
  super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_requireHashing = (bool *)0x0;
  (this->viewGroups).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->viewGroups).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->viewGroups).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->sortOrders = (size_t **)0x0;
  this->viewName = (string *)0x0;
  this->viewToGroupMapping = (size_t *)0x0;
  this->_parallelizeGroup = (bool *)0x0;
  this->_threadsPerGroup = (size_t *)0x0;
  (this->aggregateMap)._M_h._M_buckets = &(this->aggregateMap)._M_h._M_single_bucket;
  (this->aggregateMap)._M_h._M_bucket_count = 1;
  (this->aggregateMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->aggregateMap)._M_h._M_element_count = 0;
  (this->aggregateMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  memset(&(this->aggregateMap)._M_h._M_rehash_policy._M_next_resize,0,0x100);
  (this->aggregateHeader)._M_dataplus._M_p = (pointer)&(this->aggregateHeader).field_2;
  (this->aggregateHeader)._M_string_length = 0;
  (this->aggregateHeader).field_2._M_local_buf[0] = '\0';
  (this->postRemapping).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->postRemapping).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->postRemapping).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->viewLoopFactors).
  super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->viewLoopFactors).
  super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->viewLoopFactors).
  super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->numAggregateIndexes = (size_t *)0x0;
  (this->variableDependency).
  super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->variableDependency).
  super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->variableDependency).
  super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->coveredVariables).
  super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->coveredVariables).
  super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->coveredVariables).
  super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->addableViews).m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->addableViews).m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->addableViews).m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->addableViews).m_num_bits = 0;
  (this->newAggregateRegister).
  super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->newAggregateRegister).
  super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->newAggregateRegister).
  super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->aggregateRegisterMap).
  super__Vector_base<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->aggregateRegisterMap).
  super__Vector_base<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->aggregateRegisterMap).
  super__Vector_base<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->aggregateRemapping).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->aggregateRemapping).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->aggregateRemapping).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->newAggregateRemapping).
  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->newAggregateRemapping).
  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->newAggregateRemapping).
  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->localProductRemapping).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->localProductRemapping).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->localProductRemapping).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->localProductList).
  super__Vector_base<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->localProductList).
  super__Vector_base<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->localProductMap).
  super__Vector_base<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->localProductList).
  super__Vector_base<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->localProductMap).
  super__Vector_base<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->localProductMap).
  super__Vector_base<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->productToVariableRegister).
  super__Vector_base<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>,_std::allocator<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->productToVariableRegister).
  super__Vector_base<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>,_std::allocator<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->productToVariableMap).
  super__Vector_base<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>,_std::allocator<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->productToVariableRegister).
  super__Vector_base<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>,_std::allocator<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->productToVariableMap).
  super__Vector_base<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>,_std::allocator<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->productToVariableMap).
  super__Vector_base<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>,_std::allocator<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->viewProductRemapping).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->viewProductRemapping).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->viewProductRemapping).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->viewProductList).
  super__Vector_base<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->viewProductList).
  super__Vector_base<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->viewProductMap).
  super__Vector_base<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>,_std::allocator<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->viewProductList).
  super__Vector_base<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->viewProductMap).
  super__Vector_base<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>,_std::allocator<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->viewProductMap).
  super__Vector_base<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>,_std::allocator<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  memset(&this->postRegisterMap,0,0x288);
  Launcher::getTreeDecomposition
            ((launcher->super___shared_ptr<Launcher,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  p_Var1 = (this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  (this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_a8;
  (this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_a0;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  Launcher::getCompiler((launcher->super___shared_ptr<Launcher,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
  ;
  p_Var1 = (this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  return;
}

Assistant:

CppGenerator::CppGenerator(std::shared_ptr<Launcher> launcher)
{
    _td = launcher->getTreeDecomposition();
    _qc = launcher->getCompiler();
}